

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O2

void av1_cnn_add_c(float **output,int channels,int width,int height,int stride,float **add)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  int i;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar1 = 0;
  uVar3 = (ulong)(uint)width;
  if (width < 1) {
    uVar3 = uVar1;
  }
  uVar2 = (ulong)(uint)height;
  if (height < 1) {
    uVar2 = uVar1;
  }
  uVar5 = (ulong)(uint)channels;
  if (channels < 1) {
    uVar5 = uVar1;
  }
  for (; uVar1 != uVar5; uVar1 = uVar1 + 1) {
    lVar6 = 0;
    for (uVar7 = 0; lVar4 = lVar6, uVar8 = uVar3, uVar7 != uVar2; uVar7 = uVar7 + 1) {
      while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
        *(float *)((long)output[uVar1] + lVar4) =
             *(float *)((long)add[uVar1] + lVar4) + *(float *)((long)output[uVar1] + lVar4);
        lVar4 = lVar4 + 4;
      }
      lVar6 = lVar6 + (long)stride * 4;
    }
  }
  return;
}

Assistant:

void av1_cnn_add_c(float **output, int channels, int width, int height,
                   int stride, const float **add) {
  for (int c = 0; c < channels; ++c) {
    for (int i = 0; i < height; ++i)
      for (int j = 0; j < width; ++j)
        output[c][i * stride + j] += add[c][i * stride + j];
  }
}